

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemFireFightingFactored.h
# Opt level: O1

void __thiscall
ProblemFireFightingFactored::~ProblemFireFightingFactored
          (ProblemFireFightingFactored *this,void **vtt)

{
  void *pvVar1;
  pointer puVar2;
  
  pvVar1 = *vtt;
  *(void **)&(this->super_FactoredDecPOMDPDiscrete).
             super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess =
       pvVar1;
  *(void **)(&(this->super_FactoredDecPOMDPDiscrete).
              super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess.
              field_0x0 + *(long *)((long)pvVar1 + -0x58)) = vtt[0x14];
  *(void **)(&(this->super_FactoredDecPOMDPDiscrete).
              super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess.
              field_0x0 +
            *(long *)(*(long *)&(this->super_FactoredDecPOMDPDiscrete).
                                super_MultiAgentDecisionProcessDiscreteFactoredStates.
                                super_MultiAgentDecisionProcess + -0x60)) = vtt[0x15];
  *(void **)(&(this->super_FactoredDecPOMDPDiscrete).
              super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess.
              field_0x0 +
            *(long *)(*(long *)&(this->super_FactoredDecPOMDPDiscrete).
                                super_MultiAgentDecisionProcessDiscreteFactoredStates.
                                super_MultiAgentDecisionProcess + -0x68)) = vtt[0x16];
  *(void **)(&(this->super_FactoredDecPOMDPDiscrete).
              super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess.
              field_0x0 +
            *(long *)(*(long *)&(this->super_FactoredDecPOMDPDiscrete).
                                super_MultiAgentDecisionProcessDiscreteFactoredStates.
                                super_MultiAgentDecisionProcess + -0x70)) = vtt[0x17];
  *(void **)(&(this->super_FactoredDecPOMDPDiscrete).
              super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess.
              field_0x0 +
            *(long *)(*(long *)&(this->super_FactoredDecPOMDPDiscrete).
                                super_MultiAgentDecisionProcessDiscreteFactoredStates.
                                super_MultiAgentDecisionProcess + -0x40)) = vtt[0x18];
  *(void **)(&(this->super_FactoredDecPOMDPDiscrete).
              super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess.
              field_0x0 +
            *(long *)(*(long *)&(this->super_FactoredDecPOMDPDiscrete).
                                super_MultiAgentDecisionProcessDiscreteFactoredStates.
                                super_MultiAgentDecisionProcess + -0x50)) = vtt[0x19];
  *(void **)(&(this->super_FactoredDecPOMDPDiscrete).
              super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess.
              field_0x0 +
            *(long *)(*(long *)&(this->super_FactoredDecPOMDPDiscrete).
                                super_MultiAgentDecisionProcessDiscreteFactoredStates.
                                super_MultiAgentDecisionProcess + -0x48)) = vtt[0x1a];
  *(void **)&(this->super_FactoredDecPOMDPDiscrete).
             super_MultiAgentDecisionProcessDiscreteFactoredStates.field_0x600 = vtt[0x1b];
  puVar2 = (this->_m_nrFLs_vec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->_m_nrFLs_vec).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  puVar2 = (this->_m_nrPerStateFeatureVec).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->_m_nrPerStateFeatureVec).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  FactoredDecPOMDPDiscrete::~FactoredDecPOMDPDiscrete(&this->super_FactoredDecPOMDPDiscrete,vtt + 1)
  ;
  return;
}

Assistant:

virtual ~ProblemFireFightingFactored(){}